

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_inline_pass_param_Test::TestBody(pass_inline_pass_param_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Generator *pGVar3;
  Port *pPVar4;
  Var *pVVar5;
  Param *pPVar6;
  Expr *right;
  int64_t iVar7;
  element_type *peVar8;
  char *pcVar9;
  mapped_type *pmVar10;
  char *in_R9;
  AssertHelper local_528;
  Message local_520;
  unsigned_long local_518;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_1;
  Message local_4f8;
  unsigned_long local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar;
  key_type local_4d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b0;
  string local_480 [8];
  mapped_type src;
  VerilogModule vmod;
  AssertHelper local_3e8;
  Message local_3e0;
  allocator<char> local_3d1;
  string local_3d0;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  shared_ptr<kratos::Attribute> attr;
  allocator<char> local_371;
  string local_370;
  Param *local_350;
  Param *param1_;
  string local_340;
  Var *local_320;
  Var *v3;
  string local_310;
  Param *local_2f0;
  Param *param1;
  string local_2e0;
  Var *local_2c0;
  Var *v2;
  string local_2b0;
  Var *local_290;
  Var *v1;
  string local_280;
  Param *local_260;
  Param *param;
  string local_250;
  Var *local_230;
  Var *v;
  string local_220;
  Port *local_200;
  Port *in2;
  string local_1f0;
  Port *local_1d0;
  Port *in1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  Generator *local_178;
  Generator *child;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context ctx;
  pass_inline_pass_param_Test *this_local;
  
  ctx.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"child",&local_199);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pGVar2 = local_138;
  local_178 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"inst",(allocator<char> *)((long)&in1 + 7));
  kratos::Generator::add_child_generator(pGVar2,&local_1c0,local_178);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in1 + 7));
  pGVar2 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"in1",(allocator<char> *)((long)&in2 + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_1f0,1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in2 + 7));
  pGVar2 = local_178;
  local_1d0 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"in2",(allocator<char> *)((long)&v + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_220,1);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
  pGVar2 = local_178;
  local_200 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"v",(allocator<char> *)((long)&param + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_250,1);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&param + 7));
  pGVar2 = local_178;
  local_230 = pVVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"width",(allocator<char> *)((long)&v1 + 7));
  pPVar6 = kratos::Generator::parameter(pGVar2,&local_280,0x20);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v1 + 7));
  local_260 = pPVar6;
  (*(pPVar6->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar6,4);
  (*(local_1d0->super_Var).super_IRNode._vptr_IRNode[0x23])(local_1d0,local_260);
  (*(local_200->super_Var).super_IRNode._vptr_IRNode[0x23])(local_200,local_260);
  (*(local_230->super_IRNode)._vptr_IRNode[0x23])(local_230,local_260);
  pGVar2 = local_178;
  pVVar5 = local_230;
  right = kratos::Var::operator&(&local_1d0->super_Var,&local_200->super_Var);
  kratos::Generator::wire(pGVar2,pVVar5,&right->super_Var);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"v1",(allocator<char> *)((long)&v2 + 7));
  iVar7 = kratos::Const::value(&local_260->super_Const);
  pVVar5 = kratos::Generator::var(pGVar2,&local_2b0,(uint32_t)iVar7);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v2 + 7));
  pGVar2 = local_138;
  local_290 = pVVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"v2",(allocator<char> *)((long)&param1 + 7));
  iVar7 = kratos::Const::value(&local_260->super_Const);
  pVVar5 = kratos::Generator::var(pGVar2,&local_2e0,(uint32_t)iVar7);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&param1 + 7));
  pGVar2 = local_178;
  local_2c0 = pVVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"param1",(allocator<char> *)((long)&v3 + 7));
  pPVar6 = kratos::Generator::parameter(pGVar2,&local_310,0x20);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v3 + 7));
  local_2f0 = pPVar6;
  (*(pPVar6->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar6,4);
  pGVar2 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"v3",(allocator<char> *)((long)&param1_ + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_340,2,1);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&param1_ + 7));
  local_320 = pVVar5;
  kratos::Var::set_size_param(pVVar5,0,(Var *)local_2f0);
  (*(local_320->super_IRNode)._vptr_IRNode[0x23])(local_320,local_2f0);
  kratos::Generator::wire(local_138,&local_1d0->super_Var,local_290);
  kratos::Generator::wire(local_138,&local_200->super_Var,local_2c0);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"p",&local_371);
  pPVar6 = kratos::Generator::parameter(pGVar2,&local_370,0x20);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  local_350 = pPVar6;
  (*(pPVar6->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar6,4);
  pPVar6 = local_2f0;
  kratos::Var::as<kratos::Param>
            ((Var *)&attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  kratos::Param::set_value
            (pPVar6,(shared_ptr<kratos::Param> *)
                    &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  std::shared_ptr<kratos::Param>::~shared_ptr
            ((shared_ptr<kratos::Param> *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::fix_assignment_type(local_138);
  kratos::verify_generator_connectivity(local_138);
  kratos::verify_assignments(local_138);
  std::make_shared<kratos::Attribute>();
  peVar8 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  std::__cxx11::string::operator=((string *)&peVar8->value_str,"inline");
  kratos::IRNode::add_attribute
            (&local_178->super_IRNode,(shared_ptr<kratos::Attribute> *)&gtest_ar_.message_);
  kratos::inline_instance(local_138);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"inst",&local_3d1);
  bVar1 = kratos::Generator::has_child_generator(pGVar2,&local_3d0);
  local_3a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vmod.manager_.collect_perf_,(internal *)local_3a8,
               (AssertionResult *)"mod.has_child_generator(\"inst\")","true","false",in_R9);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x212,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&vmod.manager_.collect_perf_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  kratos::VerilogModule::VerilogModule((VerilogModule *)((long)&src.field_2 + 8),local_138);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            (&local_4b0,(VerilogModule *)((long)&src.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"mod",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_4b0,&local_4d0);
  std::__cxx11::string::string(local_480,(string *)pmVar10);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_4b0);
  local_4f0 = std::__cxx11::string::find((char *)local_480,0x43a241);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_4e8,"src.find(\"width\")","std::string::npos",&local_4f0,
             &std::__cxx11::string::npos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x216,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  local_518 = std::__cxx11::string::find((char *)local_480,0x430a3d);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_510,"src.find(\"logic [p-1:0][p-1:0] v3;\")","std::string::npos",
             &local_518,&std::__cxx11::string::npos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x217,pcVar9);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  std::__cxx11::string::~string(local_480);
  kratos::VerilogModule::~VerilogModule((VerilogModule *)((long)&src.field_2 + 8));
  std::shared_ptr<kratos::Attribute>::~shared_ptr
            ((shared_ptr<kratos::Attribute> *)&gtest_ar_.message_);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, inline_pass_param) {
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    auto &param = child.parameter("width", 32);
    param.set_value(4);
    in1.set_width_param(&param);
    in2.set_width_param(&param);
    v.set_width_param(&param);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", param.value());
    auto &v2 = mod.var("v2", param.value());
    auto &param1 = child.parameter("param1", 32);
    param1.set_value(4);
    auto &v3 = child.var("v3", 2, 1);
    v3.set_size_param(0, &param1);
    v3.set_width_param(&param1);

    mod.wire(in1, v1);
    mod.wire(in2, v2);
    // will not be used
    auto &param1_ = mod.parameter("p", 32);
    param1_.set_value(4);
    param1.set_value(param1_.as<Param>());

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    auto attr = std::make_shared<Attribute>();
    attr->value_str = "inline";
    child.add_attribute(attr);

    inline_instance(&mod);

    EXPECT_FALSE(mod.has_child_generator("inst"));

    VerilogModule vmod(&mod);
    auto src = vmod.verilog_src()["mod"];
    EXPECT_EQ(src.find("width"), std::string::npos);
    EXPECT_NE(src.find("logic [p-1:0][p-1:0] v3;"), std::string::npos);
}